

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

void SimpleHFilter16_C(uint8_t *p,int stride,int thresh)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int thresh2;
  int i;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    iVar1 = NeedsFilter_C((uint8_t *)(in_RDI + local_14 * in_ESI),1,in_EDX * 2 + 1);
    if (iVar1 != 0) {
      DoFilter2_C((uint8_t *)(in_RDI + local_14 * in_ESI),1);
    }
  }
  return;
}

Assistant:

static void SimpleHFilter16_C(uint8_t* p, int stride, int thresh) {
  int i;
  const int thresh2 = 2 * thresh + 1;
  for (i = 0; i < 16; ++i) {
    if (NeedsFilter_C(p + i * stride, 1, thresh2)) {
      DoFilter2_C(p + i * stride, 1);
    }
  }
}